

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtils.hpp
# Opt level: O0

void OpenMD::Utils::
     deletePointers<std::vector<OpenMD::Restraint*,std::allocator<OpenMD::Restraint*>>>
               (vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_> *container)

{
  bool bVar1;
  iterator val;
  Restraint **elem;
  iterator __end0;
  iterator __begin0;
  vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_> *__range3;
  vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_> *in_stack_ffffffffffffffd8;
  __normal_iterator<OpenMD::Restraint_**,_std::vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (Restraint **)
       std::vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>::begin
                 (in_stack_ffffffffffffffd8);
  val = std::vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>::end
                  (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Restraint_**,_std::vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>_>
                        *)val._M_current,
                       (__normal_iterator<OpenMD::Restraint_**,_std::vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>_>
                        *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd8 =
         (vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_> *)
         __gnu_cxx::
         __normal_iterator<OpenMD::Restraint_**,_std::vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>_>
         ::operator*(local_18);
    details::lifted_deleter<OpenMD::Restraint*>((Restraint *)val._M_current);
    __gnu_cxx::
    __normal_iterator<OpenMD::Restraint_**,_std::vector<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void deletePointers(Container& container) {
    if constexpr(details::is_container_v<typename Container::value_type>) {
      for (auto& elem : container)
        deletePointers(elem);
    } else {
      for (auto& elem : container)
        details::lifted_deleter(elem);
    }
  }